

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O2

uint64_t MurmurHash64A(void *key,int len,uint64_t seed)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (long)len * -0x395b586ca42e166b ^ seed;
  lVar1 = (long)(len / 8);
  for (lVar2 = 0; lVar1 * 8 - lVar2 != 0; lVar2 = lVar2 + 8) {
    uVar4 = *(long *)((long)key + lVar2) * -0x395b586ca42e166b;
    uVar3 = ((uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b ^ uVar3) * -0x395b586ca42e166b;
  }
  switch(len & 7) {
  case 7:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar1 * 8 + 6) << 0x30;
  case 6:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar1 * 8 + 5) << 0x28;
  case 5:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar1 * 8 + 4) << 0x20;
  case 4:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar1 * 8 + 3) << 0x18;
  case 3:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar1 * 8 + 2) << 0x10;
  case 2:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar1 * 8 + 1) << 8;
  case 1:
    uVar3 = (*(byte *)((long)key + lVar1 * 8) ^ uVar3) * -0x395b586ca42e166b;
  case 0:
    uVar3 = (uVar3 >> 0x2f ^ uVar3) * -0x395b586ca42e166b;
    return uVar3 >> 0x2f ^ uVar3;
  }
}

Assistant:

uint64_t MurmurHash64A ( const void * key, int len, uint64_t seed )
{
  const uint64_t m = BIG_CONSTANT(0xc6a4a7935bd1e995);
  const int r = 47;

  uint64_t h = seed ^ (len * m);

  const uint64_t * data = (const uint64_t *)key;
  const uint64_t * end = data + (len/8);

  while(data != end)
  {
    uint64_t k = *data++;

    k *= m; 
    k ^= k >> r; 
    k *= m; 
    
    h ^= k;
    h *= m; 
  }

  const unsigned char * data2 = (const unsigned char*)data;

  switch(len & 7)
  {
  case 7: h ^= uint64_t(data2[6]) << 48;
  case 6: h ^= uint64_t(data2[5]) << 40;
  case 5: h ^= uint64_t(data2[4]) << 32;
  case 4: h ^= uint64_t(data2[3]) << 24;
  case 3: h ^= uint64_t(data2[2]) << 16;
  case 2: h ^= uint64_t(data2[1]) << 8;
  case 1: h ^= uint64_t(data2[0]);
          h *= m;
  };
 
  h ^= h >> r;
  h *= m;
  h ^= h >> r;

  return h;
}